

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

ssh_rportfwd *
ssh2_rportfwd_alloc(ConnectionLayer *cl,char *shost,int sport,char *dhost,int dport,
                   int addressfamily,char *log_description,PortFwdRecord *pfr,
                   ssh_sharing_connstate *share_ctx)

{
  LogContext *pLVar1;
  char *pcVar2;
  ssh_rportfwd *psVar3;
  PktOut *pPVar4;
  PktOut *pktout;
  ssh_rportfwd *rpf;
  ssh2_connection_state *s;
  int addressfamily_local;
  int dport_local;
  char *dhost_local;
  int sport_local;
  char *shost_local;
  ConnectionLayer *cl_local;
  
  cl_local = (ConnectionLayer *)safemalloc(1,0x38,0);
  if (cl[-6].logctx == (LogContext *)0x0) {
    pLVar1 = (LogContext *)newtree234(ssh2_rportfwd_cmp);
    cl[-6].logctx = pLVar1;
  }
  pcVar2 = dupstr(shost);
  ((ssh_rportfwd *)cl_local)->shost = pcVar2;
  ((ssh_rportfwd *)cl_local)->sport = sport;
  pcVar2 = dupstr(dhost);
  ((ssh_rportfwd *)cl_local)->dhost = pcVar2;
  ((ssh_rportfwd *)cl_local)->dport = dport;
  ((ssh_rportfwd *)cl_local)->addressfamily = addressfamily;
  pcVar2 = dupstr(log_description);
  ((ssh_rportfwd *)cl_local)->log_description = pcVar2;
  ((ssh_rportfwd *)cl_local)->pfr = pfr;
  ((ssh_rportfwd *)cl_local)->share_ctx = share_ctx;
  psVar3 = (ssh_rportfwd *)add234((tree234 *)cl[-6].logctx,cl_local);
  if (psVar3 == (ssh_rportfwd *)cl_local) {
    if (((ssh_rportfwd *)cl_local)->share_ctx == (ssh_sharing_connstate *)0x0) {
      pPVar4 = ssh_bpp_new_pktout((BinaryPacketProtocol *)cl[1].vt,0x50);
      BinarySink_put_stringz(pPVar4->binarysink_,"tcpip-forward");
      BinarySink_put_bool(pPVar4->binarysink_,true);
      BinarySink_put_stringz(pPVar4->binarysink_,((ssh_rportfwd *)cl_local)->shost);
      BinarySink_put_uint32(pPVar4->binarysink_,(ulong)((ssh_rportfwd *)cl_local)->sport);
      pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar4->qnode);
      ssh2_queue_global_request_handler
                ((ssh2_connection_state *)&cl[-0xe].vt,ssh2_rportfwd_globreq_response,cl_local);
    }
  }
  else {
    free_rportfwd((ssh_rportfwd *)cl_local);
    cl_local = (ConnectionLayer *)0x0;
  }
  return (ssh_rportfwd *)cl_local;
}

Assistant:

struct ssh_rportfwd *ssh2_rportfwd_alloc(
    ConnectionLayer *cl,
    const char *shost, int sport, const char *dhost, int dport,
    int addressfamily, const char *log_description, PortFwdRecord *pfr,
    ssh_sharing_connstate *share_ctx)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh_rportfwd *rpf = snew(struct ssh_rportfwd);

    if (!s->rportfwds)
        s->rportfwds = newtree234(ssh2_rportfwd_cmp);

    rpf->shost = dupstr(shost);
    rpf->sport = sport;
    rpf->dhost = dupstr(dhost);
    rpf->dport = dport;
    rpf->addressfamily = addressfamily;
    rpf->log_description = dupstr(log_description);
    rpf->pfr = pfr;
    rpf->share_ctx = share_ctx;

    if (add234(s->rportfwds, rpf) != rpf) {
        free_rportfwd(rpf);
        return NULL;
    }

    if (!rpf->share_ctx) {
        PktOut *pktout = ssh_bpp_new_pktout(
            s->ppl.bpp, SSH2_MSG_GLOBAL_REQUEST);
        put_stringz(pktout, "tcpip-forward");
        put_bool(pktout, true);       /* want reply */
        put_stringz(pktout, rpf->shost);
        put_uint32(pktout, rpf->sport);
        pq_push(s->ppl.out_pq, pktout);

        ssh2_queue_global_request_handler(
            s, ssh2_rportfwd_globreq_response, rpf);
    }

    return rpf;
}